

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

string * google::protobuf::StrCat_abi_cxx11_(AlphaNum *a,AlphaNum *b)

{
  char *out_00;
  AlphaNum *in_RDX;
  AlphaNum *in_RSI;
  AlphaNum *in_RDI;
  char *out;
  char *begin;
  string *result;
  AlphaNum *x1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  reference local_38;
  undefined1 local_19;
  AlphaNum *local_18;
  AlphaNum *local_10;
  
  local_19 = 0;
  x1 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  out_00 = (char *)strings::AlphaNum::size(local_10);
  strings::AlphaNum::size(local_18);
  std::__cxx11::string::resize((ulong)in_RDI);
  local_40._M_current = (char *)std::__cxx11::string::begin();
  local_38 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_40);
  Append2(out_00,x1,in_RDI);
  return (string *)x1;
}

Assistant:

string StrCat(const AlphaNum &a, const AlphaNum &b) {
  string result;
  result.resize(a.size() + b.size());
  char *const begin = &*result.begin();
  char *out = Append2(begin, a, b);
  GOOGLE_DCHECK_EQ(out, begin + result.size());
  return result;
}